

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

mpack_node_t mpack_node_map_at(mpack_node_t node,size_t index,size_t offset)

{
  mpack_error_t mVar1;
  mpack_node_data_t *data;
  mpack_tree_t *tree;
  size_t offset_local;
  size_t index_local;
  mpack_node_t node_local;
  
  tree = node.tree;
  mVar1 = mpack_node_error(node);
  if (mVar1 == mpack_ok) {
    if ((node.data)->type == mpack_type_map) {
      if (index < (node.data)->len) {
        data = mpack_node_child(node,index * 2 + offset);
        join_0x00000010_0x00000000_ = mpack_node(tree,data);
      }
      else {
        mpack_node_flag_error(node,mpack_error_data);
        join_0x00000010_0x00000000_ = mpack_tree_nil_node(tree);
      }
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      join_0x00000010_0x00000000_ = mpack_tree_nil_node(tree);
    }
  }
  else {
    join_0x00000010_0x00000000_ = mpack_tree_nil_node(tree);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

MPACK_INLINE mpack_node_t mpack_node_map_at(mpack_node_t node, size_t index, size_t offset) {
    if (mpack_node_error(node) != mpack_ok)
        return mpack_tree_nil_node(node.tree);

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return mpack_tree_nil_node(node.tree);
    }

    if (index >= node.data->len) {
        mpack_node_flag_error(node, mpack_error_data);
        return mpack_tree_nil_node(node.tree);
    }

    return mpack_node(node.tree, mpack_node_child(node, index * 2 + offset));
}